

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_mul_v_s256_256_1280(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [32];
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 (*in_RDX) [32];
  ulong uVar5;
  long in_RSI;
  long in_RDI;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint j_1;
  uint j;
  word256 mask;
  uint i;
  word idx;
  uint w;
  word256 cval [5];
  block_t *Ablock;
  word *vptr;
  size_t in_stack_fffffffffffffd20;
  word in_stack_fffffffffffffd28;
  uint local_2c8;
  uint local_2c4;
  int local_294;
  int local_284;
  ulong local_280 [23];
  undefined1 (*local_1c8) [32];
  long local_1c0;
  long local_1a8;
  undefined1 (*local_168) [32];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  ulong local_a0;
  ulong uStack_98;
  ulong uStack_90;
  ulong uStack_88;
  ulong local_80;
  ulong uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  local_280[0] = 0;
  local_280[1] = 0;
  local_280[2] = 0;
  local_280[3] = 0;
  local_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  local_280[4] = 0;
  local_280[5] = 0;
  local_280[6] = 0;
  local_280[7] = 0;
  local_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  local_280[8] = 0;
  local_280[9] = 0;
  local_280[10] = 0;
  local_280[0xb] = 0;
  local_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  local_280[0xc] = 0;
  local_280[0xd] = 0;
  local_280[0xe] = 0;
  local_280[0xf] = 0;
  local_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  uVar3 = 0;
  uVar7 = 0;
  uVar9 = 0;
  uVar5 = 0;
  local_280[0x10] = 0;
  local_280[0x11] = 0;
  local_280[0x12] = 0;
  local_280[0x13] = 0;
  local_1c8 = in_RDX;
  local_1c0 = in_RSI;
  local_1a8 = in_RDI;
  for (local_284 = 4; local_284 != 0; local_284 = local_284 + -1) {
    for (local_294 = 0x40; local_294 != 0; local_294 = local_294 + -1) {
      uVar6 = uVar3;
      uVar8 = uVar7;
      uVar10 = uVar9;
      uVar11 = uVar5;
      mm256_compute_mask(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      uVar3 = uVar6;
      uVar7 = uVar8;
      uVar9 = uVar10;
      uVar5 = uVar11;
      for (local_2c4 = 0; local_2c4 < 5; local_2c4 = local_2c4 + 1) {
        uVar3 = (ulong)local_2c4;
        local_a0 = local_280[uVar3 * 4];
        uStack_98 = local_280[uVar3 * 4 + 1];
        uStack_90 = local_280[uVar3 * 4 + 2];
        uStack_88 = local_280[uVar3 * 4 + 3];
        local_168 = local_1c8;
        local_60 = *(undefined8 *)*local_1c8;
        uStack_58 = *(undefined8 *)(*local_1c8 + 8);
        uStack_50 = *(undefined8 *)(*local_1c8 + 0x10);
        uStack_48 = *(undefined8 *)(*local_1c8 + 0x18);
        auVar1._8_8_ = uVar8;
        auVar1._0_8_ = uVar6;
        auVar1._16_8_ = uVar10;
        auVar1._24_8_ = uVar11;
        local_c0 = vpand_avx2(*local_1c8,auVar1);
        uVar3 = local_a0 ^ local_c0._0_8_;
        uVar7 = uStack_98 ^ local_c0._8_8_;
        uVar9 = uStack_90 ^ local_c0._16_8_;
        uVar5 = uStack_88 ^ local_c0._24_8_;
        uVar4 = (ulong)local_2c4;
        local_280[uVar4 * 4] = uVar3;
        local_280[uVar4 * 4 + 1] = uVar7;
        local_280[uVar4 * 4 + 2] = uVar9;
        local_280[uVar4 * 4 + 3] = uVar5;
        local_1c8 = local_1c8 + 1;
        local_80 = uVar6;
        uStack_78 = uVar8;
        uStack_70 = uVar10;
        uStack_68 = uVar11;
      }
    }
    local_1c0 = local_1c0 + 8;
  }
  for (local_2c8 = 0; local_2c8 < 5; local_2c8 = local_2c8 + 1) {
    puVar2 = (ulong *)(local_1a8 + (ulong)local_2c8 * 0x20);
    uVar5 = (ulong)local_2c8;
    uVar3 = local_280[uVar5 * 4 + 1];
    uVar7 = local_280[uVar5 * 4 + 2];
    uVar9 = local_280[uVar5 * 4 + 3];
    *puVar2 = local_280[uVar5 * 4];
    puVar2[1] = uVar3;
    puVar2[2] = uVar7;
    puVar2[3] = uVar9;
  }
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_mul_v_s256_256_1280(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[5] = {mm256_zero, mm256_zero, mm256_zero, mm256_zero, mm256_zero};
  for (unsigned int w = 4; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 1, idx >>= 1) {
      const word256 mask = mm256_compute_mask(idx, 0);
      for (unsigned int j = 0; j < 5; ++j, ++Ablock) {
        cval[j] = mm256_xor_mask(cval[j], mm256_load(Ablock->w64), mask);
      }
    }
  }

  for (unsigned int j = 0; j < 5; ++j) {
    mm256_store(BLOCK(c, j)->w64, cval[j]);
  }
}